

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

void * Abc_NtkMiterSatCreate(Abc_Ntk_t *pNtk,int fAllPrimes)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int local_38;
  int i;
  int RetValue;
  Abc_Obj_t *pNode;
  sat_solver *pSat;
  int fAllPrimes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsBddLogic(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x27e,"void *Abc_NtkMiterSatCreate(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    nMuxes = 0;
    pNtk_local = (Abc_Ntk_t *)sat_solver_new();
    iVar1 = Abc_NtkMiterSatCreateInt((sat_solver *)pNtk_local,pNtk);
    sat_solver_store_mark_roots((sat_solver *)pNtk_local);
    for (local_38 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_38 < iVar2; local_38 = local_38 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_38);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef;
      }
    }
    if (iVar1 == 0) {
      sat_solver_delete((sat_solver *)pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
  }
  else {
    pNtk_local = (Abc_Ntk_t *)Abc_NtkMiterSatCreateLogic(pNtk,fAllPrimes);
  }
  return pNtk_local;
}

Assistant:

void * Abc_NtkMiterSatCreate( Abc_Ntk_t * pNtk, int fAllPrimes )
{
    sat_solver * pSat;
    Abc_Obj_t * pNode;
    int RetValue, i; //, clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
        return Abc_NtkMiterSatCreateLogic(pNtk, fAllPrimes);

    nMuxes = 0;
    pSat = sat_solver_new();
//sat_solver_store_alloc( pSat );
    RetValue = Abc_NtkMiterSatCreateInt( pSat, pNtk );
sat_solver_store_mark_roots( pSat );

    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->fMarkA = 0;
//    ASat_SolverWriteDimacs( pSat, "temp_sat.cnf", NULL, NULL, 1 );
    if ( RetValue == 0 )
    {
        sat_solver_delete(pSat);
        return NULL;
    }
//    printf( "Ands = %6d.  Muxes = %6d (%5.2f %%).  ", Abc_NtkNodeNum(pNtk), nMuxes, 300.0*nMuxes/Abc_NtkNodeNum(pNtk) );
//    ABC_PRT( "Creating sat_solver", Abc_Clock() - clk );
    return pSat;
}